

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O0

void __thiscall
ktx::OptionsEncodeBasis<true>::captureCodecOption(OptionsEncodeBasis<true> *this,char *name)

{
  v10 *in_RSI;
  long in_RDI;
  undefined1 in_stack_00000138 [16];
  undefined1 in_stack_00000148 [16];
  char *local_108 [2];
  string local_f8 [32];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_a8;
  char *local_a0;
  size_t local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *local_90
  ;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_70;
  undefined8 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_58;
  undefined8 local_50;
  undefined8 *local_48;
  char **local_40;
  char *local_38;
  size_t sStack_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  char *local_8;
  
  local_20 = local_108;
  local_28 = " --{}";
  local_18 = " --{}";
  local_108[0] = " --{}";
  local_10 = local_20;
  local_98 = std::char_traits<char>::length((char_type *)0x265aac);
  local_8 = local_28;
  local_88 = local_108[0];
  local_90 = &local_d8;
  local_40 = &local_88;
  local_a0 = local_108[0];
  sStack_80 = local_98;
  local_78 = local_f8;
  local_38 = local_a0;
  sStack_30 = local_98;
  local_c8[0] = ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*>
                          (local_90,in_RSI,(char **)local_f8);
  local_68 = &local_b0;
  local_70 = local_c8;
  local_50 = 0xc;
  local_b0 = 0xc;
  local_60 = local_70;
  local_58 = local_70;
  local_48 = local_68;
  local_a8 = local_70;
  ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_00000148,(format_args)in_stack_00000138);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xc0),local_f8);
  std::__cxx11::string::~string(local_f8);
  return;
}

Assistant:

void captureCodecOption(const char* name) {
        codecOptions += fmt::format(" --{}", name);
    }